

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

void __thiscall
kratos::PackedSlice::set_up(PackedSlice *this,PackedStruct *struct_,string *member_name)

{
  pointer pPVar1;
  pointer __s2;
  size_t __n;
  PackedSlice *pPVar2;
  int iVar3;
  uint32_t uVar4;
  InternalException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  uint32_t uVar5;
  pointer pPVar6;
  format_args args;
  string_view format_str;
  pointer local_88;
  size_type sStack_80;
  pointer local_78;
  size_type sStack_70;
  string local_68;
  PackedStruct *local_48;
  string *local_40;
  PackedSlice *local_38;
  
  pPVar6 = (struct_->attributes).
           super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar1 = (struct_->attributes).
           super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_48 = struct_;
  local_40 = member_name;
  local_38 = this;
  if (pPVar6 != pPVar1) {
    __s2 = (member_name->_M_dataplus)._M_p;
    __n = member_name->_M_string_length;
    uVar5 = 0;
    do {
      if ((pPVar6->name)._M_string_length == __n) {
        if (__n == 0) {
LAB_0034a47f:
          if (pPVar6->struct_ == (PackedStruct *)0x0) {
            uVar4 = pPVar6->width;
          }
          else {
            uVar4 = PackedStruct::bitwidth(pPVar6->struct_);
          }
          pPVar2 = local_38;
          (local_38->super_VarSlice).high = (uVar4 + uVar5) - 1;
          (local_38->super_VarSlice).low = uVar5;
          (local_38->super_VarSlice).super_Var.is_signed_ = pPVar6->signed_;
          iVar3 = (*(((local_38->super_VarSlice).parent_var)->super_IRNode)._vptr_IRNode[0x26])();
          (pPVar2->super_VarSlice).var_high_ = (iVar3 + uVar5 + uVar4) - 1;
          uVar5 = (pPVar2->super_VarSlice).low;
          iVar3 = (*(((pPVar2->super_VarSlice).parent_var)->super_IRNode)._vptr_IRNode[0x26])();
          uVar5 = iVar3 + uVar5;
          (pPVar2->super_VarSlice).var_low_ = uVar5;
          (pPVar2->super_VarSlice).super_Var.var_width_ =
               ((pPVar2->super_VarSlice).var_high_ - uVar5) + 1;
          pPVar2->def_ = pPVar6;
          return;
        }
        iVar3 = bcmp((pPVar6->name)._M_dataplus._M_p,__s2,__n);
        if (iVar3 == 0) goto LAB_0034a47f;
      }
      if (pPVar6->struct_ == (PackedStruct *)0x0) {
        uVar4 = pPVar6->width;
      }
      else {
        uVar4 = PackedStruct::bitwidth(pPVar6->struct_);
      }
      uVar5 = uVar5 + uVar4;
      pPVar6 = pPVar6 + 1;
    } while (pPVar6 != pPVar1);
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_88 = (local_40->_M_dataplus)._M_p;
  sStack_80 = local_40->_M_string_length;
  local_78 = (local_48->struct_name)._M_dataplus._M_p;
  sStack_70 = (local_48->struct_name)._M_string_length;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_88;
  format_str.size_ = 0xdd;
  format_str.data_ = (char *)0x19;
  fmt::v7::detail::vformat_abi_cxx11_
            (&local_68,(detail *)"{0} does not exist in {1}",format_str,args);
  InternalException::InternalException(this_00,&local_68);
  __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void PackedSlice::set_up(const kratos::PackedStruct &struct_, const std::string &member_name) {
    // compute the high and low
    uint32_t low_ = 0;
    bool found = false;
    for (auto const &def : struct_.attributes) {
        if (def.name == member_name) {
            found = true;
            high = def.bitwidth() + low_ - 1;
            low = low_;
            is_signed_ = def.signed_;
            var_high_ = high + parent_var->var_low();
            var_low_ = low + parent_var->var_low();
            var_width_ = var_high_ - var_low_ + 1;
            def_ = &def;
            break;
        } else {
            low_ += def.bitwidth();
        }
    }

    if (!found) {
        throw InternalException(
            ::format("{0} does not exist in {1}", member_name, struct_.struct_name));
    }
}